

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbcx.h
# Opt level: O0

bool rgbcx::unpack_bc1(void *pBlock_bits,void *pPixels,bool set_alpha,bc1_approx_mode mode)

{
  uint v0;
  uint uVar1;
  uint v0_00;
  uint c0;
  uint c0_00;
  uint v1;
  uint uVar2;
  uint v1_00;
  uint c1;
  uint c1_00;
  uint32_t uVar3;
  undefined4 in_ECX;
  byte in_DL;
  anon_union_4_3_898e29d3_for_color32_0 *in_RSI;
  bc1_block *in_RDI;
  uint32_t y_1;
  uint32_t y;
  bool used_punchthrough;
  int b1;
  int g1;
  int r1;
  int cb1;
  int cg1;
  int cr1;
  int b0;
  int g0;
  int r0;
  int cb0;
  int cg0;
  int cr0;
  color32 c [4];
  uint32_t h;
  uint32_t l;
  bc1_block *pBlock;
  color32 *pDst_pixels;
  uint32_t in_stack_fffffffffffffea8;
  uint32_t in_stack_fffffffffffffeac;
  color32 *in_stack_fffffffffffffeb0;
  anon_union_4_3_898e29d3_for_color32_0 *paVar4;
  anon_union_4_3_898e29d3_for_color32_0 *local_90;
  uint local_84;
  uint local_80;
  bool local_79;
  anon_union_4_3_898e29d3_for_color32_0 local_48 [4];
  anon_union_4_3_898e29d3_for_color32_0 aaStack_38 [2];
  uint32_t local_30;
  uint32_t local_2c;
  bc1_block *local_28;
  anon_union_4_3_898e29d3_for_color32_0 *local_20;
  undefined4 local_18;
  byte local_11;
  
  local_11 = in_DL & 1;
  local_28 = in_RDI;
  local_20 = in_RSI;
  local_18 = in_ECX;
  local_2c = bc1_block::get_low_color(in_RDI);
  local_30 = bc1_block::get_high_color(local_28);
  local_90 = local_48;
  do {
    color32::color32((color32 *)&local_90->field_0);
    local_90 = local_90 + 1;
  } while (local_90 != aaStack_38);
  v0 = local_2c >> 0xb & 0x1f;
  uVar1 = local_2c >> 5 & 0x3f;
  v0_00 = local_2c & 0x1f;
  c0 = v0 << 3 | (int)v0 >> 2;
  uVar1 = uVar1 << 2 | (int)uVar1 >> 4;
  c0_00 = v0_00 << 3 | (int)v0_00 >> 2;
  v1 = local_30 >> 0xb & 0x1f;
  uVar2 = local_30 >> 5 & 0x3f;
  v1_00 = local_30 & 0x1f;
  c1 = v1 << 3 | (int)v1 >> 2;
  uVar2 = uVar2 << 2 | (int)uVar2 >> 4;
  c1_00 = v1_00 << 3 | (int)v1_00 >> 2;
  local_79 = false;
  if (local_30 < local_2c) {
    color32::set_noclamp_rgba
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac,in_stack_fffffffffffffea8,0,
               0x135c62);
    color32::set_noclamp_rgba
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac,in_stack_fffffffffffffea8,0,
               0x135c8c);
    switch(local_18) {
    case 0:
      color32::set_noclamp_rgba
                (in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac,in_stack_fffffffffffffea8,0,
                 0x135d2e);
      color32::set_noclamp_rgba
                (in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac,in_stack_fffffffffffffea8,0,
                 0x135d9f);
      break;
    case 1:
      interp_5_nv(v0,v1);
      interp_6_nv(uVar1,uVar2);
      interp_5_nv(v0_00,v1_00);
      color32::set_noclamp_rgba
                (in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac,in_stack_fffffffffffffea8,0,
                 0x135f15);
      interp_5_nv(v1,v0);
      interp_6_nv(uVar2,uVar1);
      interp_5_nv(v1_00,v0_00);
      color32::set_noclamp_rgba
                (in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac,in_stack_fffffffffffffea8,0,
                 0x135f93);
      break;
    case 2:
      interp_5_6_amd(c0,c1);
      interp_5_6_amd(uVar1,uVar2);
      interp_5_6_amd(c0_00,c1_00);
      color32::set_noclamp_rgba
                (in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac,in_stack_fffffffffffffea8,0,
                 0x136004);
      interp_5_6_amd(c1,c0);
      interp_5_6_amd(uVar2,uVar1);
      interp_5_6_amd(c1_00,c0_00);
      color32::set_noclamp_rgba
                (in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac,in_stack_fffffffffffffea8,0,
                 0x136070);
      break;
    case 3:
      color32::set_noclamp_rgba
                (in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac,in_stack_fffffffffffffea8,0,
                 0x135e1e);
      color32::set_noclamp_rgba
                (in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac,in_stack_fffffffffffffea8,0,
                 0x135e98);
    }
  }
  else {
    color32::set_noclamp_rgba
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac,in_stack_fffffffffffffea8,0,
               0x1360a2);
    color32::set_noclamp_rgba
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac,in_stack_fffffffffffffea8,0,
               0x1360c9);
    switch(local_18) {
    case 0:
    case 3:
      color32::set_noclamp_rgba
                (in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac,in_stack_fffffffffffffea8,0,
                 0x136159);
      break;
    case 1:
      interp_half_5_nv(v0,v1);
      interp_half_6_nv(uVar1,uVar2);
      interp_half_5_nv(v0_00,v1_00);
      color32::set_noclamp_rgba
                (in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac,in_stack_fffffffffffffea8,0,
                 0x1361ca);
      break;
    case 2:
      interp_half_5_6_amd(c0,c1);
      interp_half_5_6_amd(uVar1,uVar2);
      interp_half_5_6_amd(c0_00,c1_00);
      color32::set_noclamp_rgba
                (in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac,in_stack_fffffffffffffea8,0,
                 0x136238);
    }
    color32::set_noclamp_rgba
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac,in_stack_fffffffffffffea8,0,
               0x136255);
    local_79 = true;
  }
  if ((local_11 & 1) == 0) {
    for (local_84 = 0; local_84 < 4; local_84 = local_84 + 1) {
      paVar4 = local_20;
      uVar3 = bc1_block::get_selector(local_28,0,local_84);
      color32::set_rgb((color32 *)&paVar4->field_0,(color32 *)&local_48[uVar3].field_0);
      paVar4 = local_20 + 1;
      uVar3 = bc1_block::get_selector(local_28,1,local_84);
      color32::set_rgb((color32 *)&paVar4->field_0,(color32 *)&local_48[uVar3].field_0);
      paVar4 = local_20 + 2;
      uVar3 = bc1_block::get_selector(local_28,2,local_84);
      color32::set_rgb((color32 *)&paVar4->field_0,(color32 *)&local_48[uVar3].field_0);
      paVar4 = local_20 + 3;
      uVar3 = bc1_block::get_selector(local_28,3,local_84);
      color32::set_rgb((color32 *)&paVar4->field_0,(color32 *)&local_48[uVar3].field_0);
      local_20 = local_20 + 4;
    }
  }
  else {
    for (local_80 = 0; local_80 < 4; local_80 = local_80 + 1) {
      uVar3 = bc1_block::get_selector(local_28,0,local_80);
      *local_20 = local_48[uVar3];
      uVar3 = bc1_block::get_selector(local_28,1,local_80);
      local_20[1] = local_48[uVar3];
      uVar3 = bc1_block::get_selector(local_28,2,local_80);
      local_20[2] = local_48[uVar3];
      uVar3 = bc1_block::get_selector(local_28,3,local_80);
      local_20[3] = local_48[uVar3];
      local_20 = local_20 + 4;
    }
  }
  return local_79;
}

Assistant:

bool unpack_bc1(const void* pBlock_bits, void* pPixels, bool set_alpha, bc1_approx_mode mode)
	{
		color32* pDst_pixels = static_cast<color32*>(pPixels);

		static_assert(sizeof(bc1_block) == 8, "sizeof(bc1_block) == 8");
		static_assert(sizeof(bc4_block) == 8, "sizeof(bc4_block) == 8");

		const bc1_block* pBlock = static_cast<const bc1_block*>(pBlock_bits);

		const uint32_t l = pBlock->get_low_color();
		const uint32_t h = pBlock->get_high_color();

		color32 c[4];

		const int cr0 = (l >> 11) & 31;
		const int cg0 = (l >> 5) & 63;
		const int cb0 = l & 31;
		const int r0 = (cr0 << 3) | (cr0 >> 2);
		const int g0 = (cg0 << 2) | (cg0 >> 4);
		const int b0 = (cb0 << 3) | (cb0 >> 2);

		const int cr1 = (h >> 11) & 31;
		const int cg1 = (h >> 5) & 63;
		const int cb1 = h & 31;
		const int r1 = (cr1 << 3) | (cr1 >> 2);
		const int g1 = (cg1 << 2) | (cg1 >> 4);
		const int b1 = (cb1 << 3) | (cb1 >> 2);

		bool used_punchthrough = false;
				
		if (l > h)
		{
			c[0].set_noclamp_rgba(r0, g0, b0, 255);
			c[1].set_noclamp_rgba(r1, g1, b1, 255);
			switch (mode)
			{
				case bc1_approx_mode::cBC1Ideal:
					c[2].set_noclamp_rgba((r0 * 2 + r1) / 3, (g0 * 2 + g1) / 3, (b0 * 2 + b1) / 3, 255);
					c[3].set_noclamp_rgba((r1 * 2 + r0) / 3, (g1 * 2 + g0) / 3, (b1 * 2 + b0) / 3, 255);
					break;
				case bc1_approx_mode::cBC1IdealRound4:
					c[2].set_noclamp_rgba((r0 * 2 + r1 + 1) / 3, (g0 * 2 + g1 + 1) / 3, (b0 * 2 + b1 + 1) / 3, 255);
					c[3].set_noclamp_rgba((r1 * 2 + r0 + 1) / 3, (g1 * 2 + g0 + 1) / 3, (b1 * 2 + b0 + 1) / 3, 255);
					break;
				case bc1_approx_mode::cBC1NVidia:
					c[2].set_noclamp_rgba(interp_5_nv(cr0, cr1), interp_6_nv(g0, g1), interp_5_nv(cb0, cb1), 255);
					c[3].set_noclamp_rgba(interp_5_nv(cr1, cr0), interp_6_nv(g1, g0), interp_5_nv(cb1, cb0), 255);
					break;
				case bc1_approx_mode::cBC1AMD:
					c[2].set_noclamp_rgba(interp_5_6_amd(r0, r1), interp_5_6_amd(g0, g1), interp_5_6_amd(b0, b1), 255);
					c[3].set_noclamp_rgba(interp_5_6_amd(r1, r0), interp_5_6_amd(g1, g0), interp_5_6_amd(b1, b0), 255);
					break;
			}
		}
		else
		{
			c[0].set_noclamp_rgba(r0, g0, b0, 255);
			c[1].set_noclamp_rgba(r1, g1, b1, 255);
			switch (mode)
			{
				case bc1_approx_mode::cBC1Ideal:
				case bc1_approx_mode::cBC1IdealRound4:
					c[2].set_noclamp_rgba((r0 + r1) / 2, (g0 + g1) / 2, (b0 + b1) / 2, 255);
					break;
				case bc1_approx_mode::cBC1NVidia:
					c[2].set_noclamp_rgba(interp_half_5_nv(cr0, cr1), interp_half_6_nv(g0, g1), interp_half_5_nv(cb0, cb1), 255);
					break;
				case bc1_approx_mode::cBC1AMD:
					c[2].set_noclamp_rgba(interp_half_5_6_amd(r0, r1), interp_half_5_6_amd(g0, g1), interp_half_5_6_amd(b0, b1), 255);
					break;
			}

			c[3].set_noclamp_rgba(0, 0, 0, 0);
			used_punchthrough = true;
		}

		if (set_alpha)
		{
			for (uint32_t y = 0; y < 4; y++, pDst_pixels += 4)
			{
				pDst_pixels[0] = c[pBlock->get_selector(0, y)];
				pDst_pixels[1] = c[pBlock->get_selector(1, y)];
				pDst_pixels[2] = c[pBlock->get_selector(2, y)];
				pDst_pixels[3] = c[pBlock->get_selector(3, y)];
			}
		}
		else
		{
			for (uint32_t y = 0; y < 4; y++, pDst_pixels += 4)
			{
				pDst_pixels[0].set_rgb(c[pBlock->get_selector(0, y)]);
				pDst_pixels[1].set_rgb(c[pBlock->get_selector(1, y)]);
				pDst_pixels[2].set_rgb(c[pBlock->get_selector(2, y)]);
				pDst_pixels[3].set_rgb(c[pBlock->get_selector(3, y)]);
			}
		}

		return used_punchthrough;
	}